

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collect.h
# Opt level: O2

void __thiscall
server::collectservmode::leavegame(collectservmode *this,clientinfo *ci,bool disconnecting)

{
  token *ptVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ENetPacket *packet;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined7 in_register_00000011;
  ulong uVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  vector<server::collectservmode::token> *this_00;
  int local_84;
  packetbuf p;
  token local_50;
  
  (ci->state).tokens = 0;
  if ((int)CONCAT71(in_register_00000011,disconnecting) == 0) {
    return;
  }
  iVar4 = strcmp(ci->team,"good");
  if (iVar4 == 0) {
    local_84 = 1;
  }
  else {
    iVar4 = strcmp(ci->team,"evil");
    local_84 = (uint)(iVar4 == 0) * 2;
  }
  uVar5 = (this->tokens).ulen;
  this_00 = &this->tokens;
  iVar4 = 0;
  iVar9 = 0;
LAB_00145f53:
  do {
    do {
      uVar6 = uVar5;
      if ((int)uVar6 < 1) {
        return;
      }
      uVar8 = (ulong)(uVar6 - 1);
      ptVar1 = this_00->buf + uVar8;
      uVar5 = uVar6 - 1;
    } while (this_00->buf[uVar8].dropper != ci->clientnum);
    ptVar1->dropper = -0x80000000;
    if (ptVar1->team == local_84) {
      iVar7 = iVar4;
      iVar3 = iVar9 + 1;
      iVar10 = iVar9;
    }
    else {
      iVar7 = iVar4 + 1;
      iVar3 = iVar9;
      iVar10 = iVar4;
    }
    iVar9 = iVar3;
    iVar4 = iVar7;
    uVar5 = uVar6 - 1;
  } while (iVar10 < 0xf);
  packetbuf::packetbuf(&p,300,1);
  putint(&p,0x6d);
  putint(&p,ptVar1->id);
  vector<server::collectservmode::token>::removeunordered(&local_50,this_00,uVar6 - 1);
LAB_00146001:
  do {
    uVar11 = uVar8 & 0xffffffff;
    while( true ) {
      uVar8 = uVar8 - 1;
      iVar10 = (int)uVar11;
      if (iVar10 < 1) {
        putint(&p,-1);
        packet = packetbuf::finalize(&p);
        sendpacket(-1,1,packet,-1);
        packetbuf::~packetbuf(&p);
        uVar5 = 0xffffffff;
        goto LAB_00145f53;
      }
      ptVar1 = this_00->buf + (uVar8 & 0xffffffff);
      if (this_00->buf[uVar8 & 0xffffffff].dropper == ci->clientnum) break;
      uVar11 = (ulong)(iVar10 - 1);
    }
    ptVar1->dropper = -0x80000000;
    if (ptVar1->team == local_84) goto code_r0x00146050;
    iVar7 = iVar4 + 1;
    bVar2 = iVar4 < 0xf;
    iVar4 = iVar7;
  } while (bVar2);
  goto LAB_00146077;
code_r0x00146050:
  iVar7 = iVar9 + 1;
  bVar2 = 0xe < iVar9;
  iVar9 = iVar7;
  if (bVar2) {
LAB_00146077:
    putint(&p,ptVar1->id);
    vector<server::collectservmode::token>::removeunordered(&local_50,this_00,iVar10 + -1);
  }
  goto LAB_00146001;
}

Assistant:

void leavegame(clientinfo *ci, bool disconnecting = false)
    {
        ci->state.tokens = 0;
        if(disconnecting)
        {
            int team = collectteambase(ci->team), totalfriendly = 0, totalenemy = 0;
            loopvrev(tokens)
            {
                token &t = tokens[i];
                if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                {
                    packetbuf p(300, ENET_PACKET_FLAG_RELIABLE);
                    putint(p, N_EXPIRETOKENS);
                    putint(p, t.id);
                    tokens.removeunordered(i);
                    while(--i >= 0)
                    {
                        token &t = tokens[i];
                        if(t.dropper == ci->clientnum) t.dropper = INT_MIN; else if(t.dropper > INT_MIN) continue;
                        if(t.team == team ? ++totalfriendly > UNOWNEDTOKENLIMIT : ++totalenemy > UNOWNEDTOKENLIMIT)
                        {
                            putint(p, t.id);
                            tokens.removeunordered(i);
                        }
                    }
                    putint(p, -1);
                    sendpacket(-1, 1, p.finalize());
                }
            }
        }
    }